

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::string_maker<int>::to_string_abi_cxx11_(int *value)

{
  void *this;
  int *in_RSI;
  string *in_RDI;
  ostringstream os;
  string local_1b8 [48];
  ostringstream local_188 [376];
  int *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  this = (void *)std::ostream::operator<<(local_188,std::boolalpha);
  std::ostream::operator<<(this,*local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string(in_RDI,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }